

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool __thiscall
vkb::PhysicalDevice::enable_extensions_if_present
          (PhysicalDevice *this,vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  char *__rhs;
  pointer ppcVar1;
  bool bVar2;
  pointer ppcVar3;
  long lVar4;
  pointer ppcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  pointer __lhs;
  allocator<char> local_71;
  PhysicalDevice *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  pointer local_60;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  ppcVar5 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_70 = this;
  local_58 = extensions;
  while (ppcVar3 = ppcVar5, ppcVar3 != local_60) {
    __rhs = *ppcVar3;
    __lhs = (local_70->available_extensions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (local_70->available_extensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    lVar4 = (long)local_68 - (long)__lhs;
    for (lVar7 = lVar4 >> 7; pbVar6 = __lhs, 0 < lVar7; lVar7 = lVar7 + -1) {
      bVar2 = std::operator==(__lhs,__rhs);
      if (bVar2) goto LAB_00106184;
      bVar2 = std::operator==(__lhs + 1,__rhs);
      pbVar6 = __lhs + 1;
      if (bVar2) goto LAB_00106184;
      bVar2 = std::operator==(__lhs + 2,__rhs);
      pbVar6 = __lhs + 2;
      if (bVar2) goto LAB_00106184;
      bVar2 = std::operator==(__lhs + 3,__rhs);
      pbVar6 = __lhs + 3;
      if (bVar2) goto LAB_00106184;
      __lhs = __lhs + 4;
      lVar4 = lVar4 + -0x80;
    }
    lVar4 = lVar4 >> 5;
    if (lVar4 == 1) {
LAB_0010616e:
      bVar2 = std::operator==(__lhs,__rhs);
      pbVar6 = local_68;
      if (bVar2) {
        pbVar6 = __lhs;
      }
    }
    else if (lVar4 == 2) {
LAB_0010614f:
      bVar2 = std::operator==(pbVar6,__rhs);
      if (!bVar2) {
        __lhs = pbVar6 + 1;
        goto LAB_0010616e;
      }
    }
    else {
      pbVar6 = local_68;
      if ((lVar4 == 3) && (bVar2 = std::operator==(__lhs,__rhs), pbVar6 = __lhs, !bVar2)) {
        pbVar6 = __lhs + 1;
        goto LAB_0010614f;
      }
    }
LAB_00106184:
    ppcVar5 = ppcVar3 + 1;
    if (pbVar6 == (local_70->available_extensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010619a;
  }
  ppcVar1 = (local_58->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_70 = (PhysicalDevice *)&local_70->extensions_to_enable;
  for (ppcVar5 = (local_58->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                 .super__Vector_impl_data._M_start; ppcVar5 != ppcVar1; ppcVar5 = ppcVar5 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar5,&local_71);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_70,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
LAB_0010619a:
  return ppcVar3 == local_60;
}

Assistant:

bool PhysicalDevice::enable_extensions_if_present(const std::vector<const char*>& extensions) {
    for (const auto extension : extensions) {
        auto it = std::find_if(std::begin(available_extensions),
            std::end(available_extensions),
            [extension](std::string const& ext_name) { return ext_name == extension; });
        if (it == std::end(available_extensions)) return false;
    }
    for (const auto extension : extensions)
        extensions_to_enable.push_back(extension);
    return true;
}